

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddConvexPolyFilled(ImDrawList *this,ImVec2 *points,int points_count,ImU32 col)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  ImVec2 IVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uint *puVar8;
  int iVar9;
  ulong uVar10;
  ImDrawVert *pIVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  float fVar16;
  float fVar19;
  ImVec2 IVar17;
  ImVec2 IVar18;
  float fVar20;
  float fVar21;
  float afStack_48 [2];
  uint *local_40;
  uint local_38;
  int local_34;
  
  if (2 < points_count) {
    IVar4 = this->_Data->TexUvWhitePixel;
    if ((this->Flags & 2) == 0) {
      PrimReserve(this,points_count * 3 + -6,points_count);
      pIVar11 = this->_VtxWritePtr;
      uVar10 = 0;
      do {
        pIVar11->pos = points[uVar10];
        this->_VtxWritePtr->uv = IVar4;
        pIVar11 = this->_VtxWritePtr;
        pIVar11->col = col;
        pIVar11 = pIVar11 + 1;
        this->_VtxWritePtr = pIVar11;
        uVar10 = uVar10 + 1;
      } while ((uint)points_count != uVar10);
      puVar8 = this->_IdxWritePtr;
      iVar9 = 2;
      do {
        uVar3 = this->_VtxCurrentIdx;
        *puVar8 = uVar3;
        puVar8[1] = (uVar3 + iVar9) - 1;
        puVar8[2] = this->_VtxCurrentIdx + iVar9;
        puVar8 = puVar8 + 3;
        iVar9 = iVar9 + 1;
      } while (points_count != iVar9);
      this->_IdxWritePtr = puVar8;
      local_40 = &this->_VtxCurrentIdx;
    }
    else {
      local_38 = col & 0xffffff;
      local_34 = points_count * 2;
      PrimReserve(this,points_count * 9 + -6,local_34);
      local_40 = &this->_VtxCurrentIdx;
      uVar3 = this->_VtxCurrentIdx;
      puVar8 = this->_IdxWritePtr;
      iVar9 = points_count + -2;
      uVar13 = uVar3 + 2;
      do {
        *puVar8 = uVar3;
        puVar8[1] = uVar13;
        uVar13 = uVar13 + 2;
        puVar8[2] = uVar13;
        puVar8 = puVar8 + 3;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      this->_IdxWritePtr = puVar8;
      uVar12 = (ulong)(uint)points_count;
      lVar5 = -(uVar12 * 8 + 0xf & 0xfffffffffffffff0);
      lVar6 = lVar5 + -0x48;
      iVar15 = points_count + -1;
      uVar10 = 0;
      iVar9 = iVar15;
      do {
        lVar14 = (long)iVar9;
        fVar16 = points[uVar10].x - points[lVar14].x;
        fVar19 = points[uVar10].y - points[lVar14].y;
        fVar20 = fVar16 * fVar16 + fVar19 * fVar19;
        if (0.0 < fVar20) {
          fVar20 = 1.0 / SQRT(fVar20);
          fVar16 = fVar16 * fVar20;
          fVar19 = fVar19 * fVar20;
        }
        *(float *)((long)afStack_48 + lVar14 * 8 + lVar6 + 0x48) = fVar19;
        *(float *)((long)afStack_48 + lVar14 * 8 + lVar5 + 4) = -fVar16;
        iVar9 = (int)uVar10;
        uVar10 = uVar10 + 1;
      } while (uVar12 != uVar10);
      pIVar11 = this->_VtxWritePtr;
      uVar10 = 0;
      uVar13 = uVar3;
      do {
        uVar1 = *(undefined8 *)((long)afStack_48 + (long)iVar15 * 8 + lVar6 + 0x48);
        uVar2 = *(undefined8 *)((long)afStack_48 + uVar10 * 8 + lVar6 + 0x48);
        fVar19 = ((float)uVar2 + (float)uVar1) * 0.5;
        fVar20 = ((float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar1 >> 0x20)) * 0.5;
        fVar21 = fVar19 * fVar19 + fVar20 * fVar20;
        fVar16 = 0.5;
        if (0.5 <= fVar21) {
          fVar16 = fVar21;
        }
        fVar19 = (1.0 / fVar16) * fVar19 * 0.5;
        fVar16 = (1.0 / fVar16) * fVar20 * 0.5;
        IVar17.x = points[uVar10].x - fVar19;
        IVar17.y = points[uVar10].y - fVar16;
        pIVar11->pos = IVar17;
        pIVar11->uv = IVar4;
        pIVar11 = this->_VtxWritePtr;
        pIVar11->col = col;
        IVar18.x = points[uVar10].x + fVar19;
        IVar18.y = points[uVar10].y + fVar16;
        pIVar11[1].pos = IVar18;
        pIVar11[1].uv = IVar4;
        pIVar11 = this->_VtxWritePtr;
        pIVar11[1].col = local_38;
        pIVar11 = pIVar11 + 2;
        this->_VtxWritePtr = pIVar11;
        puVar8 = this->_IdxWritePtr;
        *puVar8 = uVar13;
        puVar8[1] = uVar3 + iVar15 * 2;
        uVar7 = uVar3 + 1 + iVar15 * 2;
        puVar8[2] = uVar7;
        puVar8[3] = uVar7;
        puVar8[4] = uVar13 + 1;
        puVar8[5] = uVar13;
        this->_IdxWritePtr = puVar8 + 6;
        iVar15 = (int)uVar10;
        uVar10 = uVar10 + 1;
        uVar13 = uVar13 + 2;
        points_count = local_34;
      } while (uVar12 != uVar10);
    }
    *local_40 = *local_40 + points_count;
  }
  return;
}

Assistant:

void ImDrawList::AddConvexPolyFilled(const ImVec2* points, const int points_count, ImU32 col)
{
    if (points_count < 3)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    if (Flags & ImDrawListFlags_AntiAliasedFill)
    {
        // Anti-aliased Fill
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;
        const int idx_count = (points_count-2)*3 + points_count*6;
        const int vtx_count = (points_count*2);
        PrimReserve(idx_count, vtx_count);

        // Add indexes for fill
        unsigned int vtx_inner_idx = _VtxCurrentIdx;
        unsigned int vtx_outer_idx = _VtxCurrentIdx+1;
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx+((i-1)<<1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_inner_idx+(i<<1));
            _IdxWritePtr += 3;
        }

        // Compute normals
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * sizeof(ImVec2)); //-V630
        for (int i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            const ImVec2& p0 = points[i0];
            const ImVec2& p1 = points[i1];
            float dx = p1.x - p0.x;
            float dy = p1.y - p0.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i0].x = dy;
            temp_normals[i0].y = -dx;
        }

        for (int i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            // Average normals
            const ImVec2& n0 = temp_normals[i0];
            const ImVec2& n1 = temp_normals[i1];
            float dm_x = (n0.x + n1.x) * 0.5f;
            float dm_y = (n0.y + n1.y) * 0.5f;
            IM_FIXNORMAL2F(dm_x, dm_y);
            dm_x *= AA_SIZE * 0.5f;
            dm_y *= AA_SIZE * 0.5f;

            // Add vertices
            _VtxWritePtr[0].pos.x = (points[i1].x - dm_x); _VtxWritePtr[0].pos.y = (points[i1].y - dm_y); _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;        // Inner
            _VtxWritePtr[1].pos.x = (points[i1].x + dm_x); _VtxWritePtr[1].pos.y = (points[i1].y + dm_y); _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;  // Outer
            _VtxWritePtr += 2;

            // Add indexes for fringes
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx+(i1<<1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx+(i0<<1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_outer_idx+(i0<<1));
            _IdxWritePtr[3] = (ImDrawIdx)(vtx_outer_idx+(i0<<1)); _IdxWritePtr[4] = (ImDrawIdx)(vtx_outer_idx+(i1<<1)); _IdxWritePtr[5] = (ImDrawIdx)(vtx_inner_idx+(i1<<1));
            _IdxWritePtr += 6;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Fill
        const int idx_count = (points_count-2)*3;
        const int vtx_count = points_count;
        PrimReserve(idx_count, vtx_count);
        for (int i = 0; i < vtx_count; i++)
        {
            _VtxWritePtr[0].pos = points[i]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr++;
        }
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+i-1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+i);
            _IdxWritePtr += 3;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
}